

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporterPtr Catch::anon_unknown_1::createReporter(string *reporterName,IConfigPtr *config)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  IRegistryHub *pIVar4;
  undefined4 extraout_var;
  undefined8 in_RDX;
  undefined8 in_RSI;
  IStreamingReporter *in_RDI;
  long in_FS_OFFSET;
  IStreamingReporterPtr *reporter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  ReusableStringStream *in_stack_ffffffffffffff60;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> msg;
  ReusableStringStream *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  msg._M_head_impl = in_RDI;
  pIVar4 = getRegistryHub();
  iVar3 = (*pIVar4->_vptr_IRegistryHub[2])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))
            (in_RDI,(long *)CONCAT44(extraout_var,iVar3),in_RSI,in_RDX);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                      *)0x260d79);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
              )(__uniq_ptr_data<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>,_true,_true>
                )msg._M_head_impl;
    }
  }
  else {
    ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff90);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff60,(char (*) [36])in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    ReusableStringStream::operator<<
              (in_stack_ffffffffffffff60,(char (*) [2])in_stack_ffffffffffffff58);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff58);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      throw_domain_error((string *)msg._M_head_impl);
    }
  }
  __stack_chk_fail();
}

Assistant:

IStreamingReporterPtr createReporter(std::string const& reporterName, IConfigPtr const& config) {
            auto reporter = Catch::getRegistryHub().getReporterRegistry().create(reporterName, config);
            CATCH_ENFORCE(reporter, "No reporter registered with name: '" << reporterName << "'");

            return reporter;
        }